

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O3

void output_instructions_cold_1(void)

{
  FILE *__stream;
  char *pcVar1;
  byte in_DIL;
  
  __stream = _stderr;
  pcVar1 = raviX_opcode_name((uint)in_DIL);
  fprintf(__stream,"Unsupported opcode %s\n",pcVar1);
  return;
}

Assistant:

static int output_instruction(Function *fn, Instruction *insn)
{
	int rc = 0;

	// Output the IR instruction we are compiling
	raviX_buffer_reset(&fn->tb);
	raviX_output_instruction(insn, &fn->tb);
	raviX_buffer_add_fstring(&fn->body, "// %s\n", fn->tb.buf);
	raviX_buffer_reset(&fn->tb);

	switch (insn->opcode) {
	case op_ret:
		rc = emit_op_ret(fn, insn);
		break;
	case op_br:
		rc = emit_op_br(fn, insn);
		break;
	case op_cbr:
		rc = emit_op_cbr(fn, insn);
		break;
	case op_mov:
	case op_movi:
	case op_movf:
		rc = emit_op_mov(fn, insn);
		break;
	case op_movfi:
		rc = emit_op_movfi(fn, insn);
		break;
	case op_movif:
		rc = emit_op_movif(fn, insn);
		break;
	case op_loadglobal:
	case op_get:
	case op_get_skey:
	case op_get_ikey:
	case op_tget_skey:
	case op_tget_ikey:
	case op_tget: /* TODO custom codegen */
	case op_iaget:
	case op_faget:
		rc = emit_op_load_table(fn, insn);
		break;
	case op_storeglobal:
	case op_put:
	case op_put_skey:
	case op_put_ikey:
	case op_tput_skey:
	case op_tput_ikey:
	case op_tput: /* TODO custom codegen */
	case op_iaput:
	case op_faput:
		rc = emit_op_store_table(fn, insn);
		break;
	case op_call:
		rc = emit_op_call(fn, insn);
		break;

	case op_addff:
	case op_subff:
	case op_mulff:
	case op_divff:

	case op_addii:
	case op_subii:
	case op_mulii:
	case op_divii:
	case op_bandii:
	case op_borii:
	case op_bxorii:
		rc = emit_bin_ii(fn, insn);
		break;

	case op_shlii:
	case op_shrii:
		rc = emit_bitop_ii(fn, insn);
		break;

	case op_eqii:
	case op_ltii:
	case op_leii:
	case op_eqff:
	case op_ltff:
	case op_leff:
		rc = emit_comp_ii(fn, insn);
		break;

	case op_addfi:
	case op_subfi:
	case op_mulfi:
	case op_divfi:
		rc = emit_bin_fi(fn, insn);
		break;

	case op_subif:
	case op_divif:
		rc = emit_bin_if(fn, insn);
		break;

	case op_add:
	case op_sub:
	case op_mul:
		rc = emit_op_arith(fn, insn);
		break;

	case op_not:
		rc = emit_op_not(fn, insn);
		break;

	case op_bnot:
		rc = emit_op_bnot(fn, insn);
		break;

	case op_div:
	case op_idiv:
	case op_band:
	case op_bor:
	case op_bxor:
	case op_shl:
	case op_shr:
	case op_mod:
	case op_pow:
		rc = emit_op_binary(fn, insn);
		break;

	case op_unmi:
	case op_unmf:
		rc = emit_op_unmi_unmf(fn, insn);
		break;

	case op_unm:
		rc = emit_op_unm(fn, insn);
		break;

	case op_eq:
	case op_lt:
	case op_le:
		rc = emit_generic_comp(fn, insn);
		break;

	case op_iaget_ikey:
	case op_faget_ikey:
		rc = emit_op_arrayget_ikey(fn, insn);
		break;

	case op_iaput_ival:
	case op_faput_fval:
		rc = emit_op_arrayput_val(fn, insn);
		break;

	case op_toiarray:
	case op_tofarray:
	case op_totable:
	case op_tostring:
	case op_toclosure:
	case op_toint:
		rc = emit_op_totype(fn, insn);
		break;

	case op_toflt:
		rc = emit_op_toflt(fn, insn);
		break;

	case op_totype:
		rc = emit_op_tousertype(fn, insn);
		break;

	case op_closure:
		rc = emit_op_closure(fn, insn);
		break;

	case op_newtable:
		rc = emit_op_newtable(fn, insn);
		break;

	case op_newiarray:
		rc = emit_op_newarray(fn, insn);
		break;

	case op_newfarray:
		rc = emit_op_newarray(fn, insn);
		break;

	case op_close:
		rc = emit_op_close(fn, insn);
		break;

	case op_len:
	case op_leni:
		rc = emit_op_len(fn, insn);
		break;

	case op_concat:
		rc = emit_op_concat(fn, insn);
		break;

	case op_init:
		rc = emit_op_init(fn, insn);
		break;

	case op_C__unsafe:
		rc = emit_op_C__unsafe(fn, insn);
		break;

	case op_C__new:
		rc = emit_op_C__new(fn, insn);
		break;

	default:
		fprintf(stderr, "Unsupported opcode %s\n", raviX_opcode_name(insn->opcode));
		rc = -1;
	}
	return rc;
}